

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_attn
          (llm_graph_context *this,llm_graph_input_attn_no_cache *inp,ggml_cgraph *gf,
          ggml_tensor *wo,ggml_tensor *wo_b,ggml_tensor *q_cur,ggml_tensor *k_cur,ggml_tensor *v_cur
          ,ggml_tensor *kq_b,ggml_tensor *v_mla,float kq_scale,int il)

{
  llm_graph_context *in_RCX;
  undefined8 in_RDX;
  llm_graph_input_attn_no_cache *in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  ggml_tensor *in_stack_00000010;
  ggml_cgraph *in_stack_00000018;
  ggml_tensor *cur;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *q;
  ggml_tensor **kq_mask;
  int il_00;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff8c;
  ggml_tensor *local_68;
  ggml_tensor *local_48;
  ggml_tensor **local_40;
  ggml_tensor *kq_b_00;
  
  kq_b_00 = in_RDI;
  ggml_build_forward_expand(in_RDX,in_R9);
  ggml_build_forward_expand(in_RDX,in_stack_00000008);
  ggml_build_forward_expand(in_RDX,in_stack_00000010);
  local_48 = llm_graph_input_attn_no_cache::get_kq_mask(in_RSI);
  local_40 = &local_48;
  ggml_permute(in_RDI->src[5],in_R9,0,2,1,3);
  ggml_permute(in_RDI->src[5],in_stack_00000008,0,2,1,3);
  ggml_permute(in_RDI->src[5],in_stack_00000010,0,2,1,3);
  il_00 = (int)((ulong)*local_40 >> 0x20);
  uVar1 = 0;
  local_68 = build_attn_mha((llm_graph_context *)cur,in_stack_00000018,in_stack_00000010,
                            in_stack_00000008,unaff_retaddr,kq_b_00,k,q,
                            SUB81((ulong)in_RSI >> 0x38,0),SUB84(in_RSI,0));
  cb((llm_graph_context *)in_RDI,(ggml_tensor *)CONCAT44(in_stack_ffffffffffffff8c,uVar1),
     (char *)cur,il_00);
  if (in_RCX != (llm_graph_context *)0x0) {
    local_68 = build_lora_mm(in_RCX,in_R8,in_R9);
  }
  if (in_R8 != (ggml_tensor *)0x0) {
    local_68 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_68,in_R8);
  }
  return local_68;
}

Assistant:

ggml_tensor * llm_graph_context::build_attn(
        llm_graph_input_attn_no_cache * inp,
        ggml_cgraph * gf,
        ggml_tensor * wo,
        ggml_tensor * wo_b,
        ggml_tensor * q_cur,
        ggml_tensor * k_cur,
        ggml_tensor * v_cur,
        ggml_tensor * kq_b,
        ggml_tensor * v_mla,
            float     kq_scale,
            int       il) const {
    GGML_UNUSED(n_tokens);

    // these nodes are added to the graph together so that they are not reordered
    // by doing so, the number of splits in the graph is reduced
    ggml_build_forward_expand(gf, q_cur);
    ggml_build_forward_expand(gf, k_cur);
    ggml_build_forward_expand(gf, v_cur);

    const auto & kq_mask = inp->get_kq_mask();

    ggml_tensor * q = ggml_permute(ctx0, q_cur, 0, 2, 1, 3);
    //cb(q, "q", il);

    ggml_tensor * k = ggml_permute(ctx0, k_cur, 0, 2, 1, 3);
    //cb(k, "k", il);

    ggml_tensor * v = ggml_permute(ctx0, v_cur, 0, 2, 1, 3);
    //cb(k, "v", il);

    ggml_tensor * cur = build_attn_mha(gf, q, k, v, kq_b, kq_mask, v_mla, false, kq_scale);

    cb(cur, "kqv_out", il);

    if (wo) {
        cur = build_lora_mm(wo, cur);
    }

    if (wo_b) {
        //cb(cur, "kqv_wo", il);
    }

    if (wo_b) {
        cur = ggml_add(ctx0, cur, wo_b);
    }

    return cur;
}